

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

size_t printSeparator(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  size_t i_local;
  OPTYPE *pMyOperand_local;
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    if ((pMyDisasm->Reserved_).BASE_ == 5) {
      strcpy(pMyOperand->OpMnemonic + i,"(,%");
      pMyDisasm_local = (PDISASM)(i + 3);
    }
    else {
      strcpy(pMyOperand->OpMnemonic + i,",%");
      pMyDisasm_local = (PDISASM)(i + 2);
    }
  }
  else {
    strcpy(pMyOperand->OpMnemonic + i,"+");
    pMyDisasm_local = (PDISASM)(i + 1);
  }
  return (size_t)pMyDisasm_local;
}

Assistant:

size_t __bea_callspec__ printSeparator(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  if (GV.SYNTAX_ == ATSyntax) {
    if (GV.BASE_  == 5) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(,%");
      #endif
      i+=3;
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, ",%");
      #endif
      i+=2;
    }
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i+=1;
  }
  return i;
}